

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_Resize(ResizeForm2 Resize)

{
  byte bVar1;
  const_reference pvVar2;
  code *in_RDI;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff1c;
  value_type value;
  Image *image;
  uint32_t height_;
  undefined4 in_stack_ffffffffffffff2c;
  uint32_t width_;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  Image *in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff44;
  uint32_t in_stack_ffffffffffffff48;
  uint8_t in_stack_ffffffffffffff4f;
  undefined1 local_a8 [96];
  undefined1 local_48 [40];
  code *local_8;
  
  image = (Image *)&stack0xffffffffffffffe0;
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff1c);
  height_ = 0;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image,0);
  width_ = CONCAT13(*pvVar2,(int3)in_stack_ffffffffffffff2c);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff30,width_,height_,(uint8_t)((ulong)image >> 0x38),
             (uint8_t)((ulong)image >> 0x30));
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
             in_stack_ffffffffffffff38);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dfb72);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &stack0xffffffffffffffe0,1);
  value = *pvVar2;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff30,width_,height_,(uint8_t)((ulong)image >> 0x38),
             (uint8_t)((ulong)image >> 0x30));
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
             in_stack_ffffffffffffff38);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dfbc9);
  (*local_8)(local_48,local_a8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffe0,0);
  bVar1 = Unit_Test::verifyImage(image,value);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dfc10);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1dfc1d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff30);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form2_Resize(ResizeForm2 Resize)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input  = uniformImage( intensity[0] );
        PenguinV_Image::Image output = uniformImage( intensity[1] );

        Resize( input, output );

        return verifyImage( output, intensity[0] );
    }